

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_sec
                 (year_t y,diff_t m,diff_t d,diff_t hh,diff_t mm,diff_t ss)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  hour_t hh_00;
  diff_t mm_00;
  long lVar4;
  fields fVar5;
  fields fVar6;
  second_t ss_00;
  
  fVar6._8_8_ = m;
  fVar6.y = y;
  if ((ulong)ss < 0x3c) {
    if (0x3b < (ulong)mm) {
      lVar1 = mm / 0x3c;
      mm_00 = mm % 0x3c;
      ss_00 = (second_t)ss;
      goto LAB_00344397;
    }
    if ((ulong)hh < 0x18) {
      if (m - 1U < 0xc && d - 1U < 0x1c) goto LAB_003443be;
      lVar1 = 0;
      hh_00 = (hour_t)hh;
    }
    else {
      lVar2 = hh % 0x18;
      lVar1 = (lVar2 >> 0x3f) + hh / 0x18;
      hh_00 = (char)lVar2 + '\x18';
      if (-1 < lVar2) {
        hh_00 = (char)lVar2;
      }
    }
    fVar6 = n_mon(y,m,d,lVar1,hh_00,(minute_t)mm,(second_t)ss);
  }
  else {
    lVar2 = ss % 0x3c;
    lVar4 = (lVar2 >> 0x3f) + ss / 0x3c;
    lVar1 = lVar4 / 0x3c + mm / 0x3c;
    mm_00 = lVar4 % 0x3c + mm % 0x3c;
    ss_00 = (char)lVar2 + '<';
    if (-1 < lVar2) {
      ss_00 = (char)lVar2;
    }
LAB_00344397:
    fVar6 = n_min(y,m,d,hh,lVar1,mm_00,ss_00);
  }
  uVar3 = fVar6._8_8_;
  d = uVar3 >> 8;
  hh = uVar3 >> 0x10;
  mm = uVar3 >> 0x18;
  ss = uVar3 >> 0x20;
LAB_003443be:
  fVar5._8_8_ = (ulong)(((uint)d & 0xff) << 8 | ((uint)hh & 0xff) << 0x10 | (int)mm << 0x18) |
                fVar6._8_8_ & 0xff | (ss & 0xffU) << 0x20;
  fVar5.y = fVar6.y;
  return fVar5;
}

Assistant:

CONSTEXPR_F fields n_sec(year_t y, diff_t m, diff_t d, diff_t hh, diff_t mm,
                         diff_t ss) noexcept {
  // Optimization for when (non-constexpr) fields are already normalized.
  if (0 <= ss && ss < 60) {
    const second_t nss = static_cast<second_t>(ss);
    if (0 <= mm && mm < 60) {
      const minute_t nmm = static_cast<minute_t>(mm);
      if (0 <= hh && hh < 24) {
        const hour_t nhh = static_cast<hour_t>(hh);
        if (1 <= d && d <= 28 && 1 <= m && m <= 12) {
          const day_t nd = static_cast<day_t>(d);
          const month_t nm = static_cast<month_t>(m);
          return fields(y, nm, nd, nhh, nmm, nss);
        }
        return n_mon(y, m, d, 0, nhh, nmm, nss);
      }
      return n_hour(y, m, d, hh / 24, hh % 24, nmm, nss);
    }
    return n_min(y, m, d, hh, mm / 60, mm % 60, nss);
  }
  diff_t cm = ss / 60;
  ss %= 60;
  if (ss < 0) {
    cm -= 1;
    ss += 60;
  }
  return n_min(y, m, d, hh, mm / 60 + cm / 60, mm % 60 + cm % 60,
               static_cast<second_t>(ss));
}